

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.h
# Opt level: O0

UnicodeString * __thiscall
icu_63::DecimalFormatSymbols::getSymbol
          (UnicodeString *__return_storage_ptr__,DecimalFormatSymbols *this,
          ENumberFormatSymbol symbol)

{
  UnicodeString *local_28;
  UnicodeString *strPtr;
  ENumberFormatSymbol symbol_local;
  DecimalFormatSymbols *this_local;
  
  if ((int)symbol < 0x1c) {
    local_28 = (UnicodeString *)(&this->field_0x8 + (ulong)symbol * 0x40);
  }
  else {
    local_28 = &this->fNoSymbol;
  }
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,local_28);
  return __return_storage_ptr__;
}

Assistant:

inline UnicodeString
DecimalFormatSymbols::getSymbol(ENumberFormatSymbol symbol) const {
    const UnicodeString *strPtr;
    if(symbol < kFormatSymbolCount) {
        strPtr = &fSymbols[symbol];
    } else {
        strPtr = &fNoSymbol;
    }
    return *strPtr;
}